

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cffparse.c
# Opt level: O2

FT_Error cff_parse_blend(CFF_Parser parser)

{
  FT_UInt vsindex;
  FT_UInt lenNDV;
  void *pvVar1;
  long lVar2;
  FT_Fixed *NDV;
  FT_Byte *pFVar3;
  FT_Byte *pFVar4;
  FT_Byte *pFVar5;
  long lVar6;
  undefined1 *puVar7;
  FT_Bool FVar8;
  FT_Error FVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  FT_PtrDist offset;
  ulong uVar13;
  FT_Pointer pvVar14;
  FT_Long FVar15;
  ulong uVar16;
  ulong uVar17;
  int iVar18;
  FT_Byte **ppFVar19;
  int iVar20;
  long lVar21;
  FT_Error local_34;
  
  pvVar1 = parser->object;
  if (pvVar1 == (void *)0x0) {
    return 3;
  }
  lVar2 = *(long *)((long)pvVar1 + 0x2d0);
  if (lVar2 == 0) {
    return 3;
  }
  vsindex = *(FT_UInt *)((long)pvVar1 + 0x2c8);
  lenNDV = *(FT_UInt *)(lVar2 + 0x450);
  NDV = *(FT_Fixed **)(lVar2 + 0x458);
  FVar8 = cff_blend_check_vector((CFF_Blend)(lVar2 + 0x420),vsindex,lenNDV,NDV);
  if ((FVar8 != '\0') &&
     (FVar9 = cff_blend_build_vector((CFF_Blend)(lVar2 + 0x420),vsindex,lenNDV,NDV), FVar9 != 0)) {
    return FVar9;
  }
  uVar13 = cff_parse_num(parser,parser->top + -1);
  uVar11 = (uint)uVar13;
  if (parser->stackSize < uVar11) {
    return 3;
  }
  local_34 = 0;
  uVar10 = *(int *)(lVar2 + 0x440) * uVar11;
  uVar12 = (uint)((ulong)((long)parser->top + (-8 - (long)parser->stack)) >> 3);
  iVar18 = uVar12 - uVar10;
  FVar9 = 0xa1;
  if (uVar10 <= uVar12) {
    iVar20 = uVar11 * 5;
    uVar10 = *(uint *)(lVar2 + 0x470);
    uVar12 = *(uint *)(lVar2 + 0x474);
    if (uVar12 < uVar10 + iVar20) {
      pFVar3 = *(FT_Byte **)(lVar2 + 0x460);
      pFVar4 = *(FT_Byte **)(lVar2 + 0x468);
      pvVar14 = ft_mem_realloc(*(FT_Memory *)(*(long *)(lVar2 + 0x428) + 0x10),1,(ulong)uVar12,
                               (ulong)(uVar12 + iVar20),pFVar3,&local_34);
      *(FT_Pointer *)(lVar2 + 0x460) = pvVar14;
      FVar9 = local_34;
      if (local_34 != 0) goto LAB_001fc0b9;
      uVar10 = *(uint *)(lVar2 + 0x470);
      *(ulong *)(lVar2 + 0x468) = (ulong)uVar10 + (long)pvVar14;
      *(int *)(lVar2 + 0x474) = *(int *)(lVar2 + 0x474) + iVar20;
      if ((pFVar3 != (FT_Byte *)0x0) && ((long)pvVar14 - (long)pFVar3 != 0)) {
        for (ppFVar19 = parser->stack; ppFVar19 < parser->top; ppFVar19 = ppFVar19 + 1) {
          pFVar5 = *ppFVar19;
          if ((pFVar3 <= pFVar5) && (pFVar5 < pFVar4)) {
            *ppFVar19 = pFVar5 + ((long)pvVar14 - (long)pFVar3);
          }
        }
      }
    }
    *(uint *)(lVar2 + 0x470) = uVar10 + iVar20;
    uVar11 = iVar18 + uVar11;
    uVar10 = uVar11;
    for (uVar17 = 0; uVar17 != (uVar13 & 0xffffffff); uVar17 = uVar17 + 1) {
      lVar6 = *(long *)(lVar2 + 0x448);
      uVar12 = iVar18 + (int)uVar17;
      FVar15 = cff_parse_num(parser,parser->stack + uVar12);
      iVar20 = (int)FVar15 << 0x10;
      for (lVar21 = 1; (uint)lVar21 < *(uint *)(lVar2 + 0x440); lVar21 = lVar21 + 1) {
        uVar16 = (ulong)uVar10;
        uVar10 = uVar10 + 1;
        FVar15 = cff_parse_num(parser,parser->stack + uVar16);
        iVar20 = (int)FVar15 * *(int *)(lVar6 + lVar21 * 4) + iVar20;
      }
      pFVar3 = *(FT_Byte **)(lVar2 + 0x468);
      parser->stack[uVar12] = pFVar3;
      *(FT_Byte **)(lVar2 + 0x468) = pFVar3 + 1;
      *pFVar3 = 0xff;
      puVar7 = *(undefined1 **)(lVar2 + 0x468);
      *(undefined1 **)(lVar2 + 0x468) = puVar7 + 1;
      *puVar7 = (char)((uint)iVar20 >> 0x18);
      puVar7 = *(undefined1 **)(lVar2 + 0x468);
      *(undefined1 **)(lVar2 + 0x468) = puVar7 + 1;
      *puVar7 = (char)((uint)iVar20 >> 0x10);
      puVar7 = *(undefined1 **)(lVar2 + 0x468);
      *(undefined1 **)(lVar2 + 0x468) = puVar7 + 1;
      *puVar7 = (char)((uint)iVar20 >> 8);
      puVar7 = *(undefined1 **)(lVar2 + 0x468);
      *(undefined1 **)(lVar2 + 0x468) = puVar7 + 1;
      *puVar7 = (char)iVar20;
    }
    parser->top = parser->stack + uVar11;
    FVar9 = local_34;
  }
LAB_001fc0b9:
  *(undefined1 *)(lVar2 + 0x421) = 1;
  return FVar9;
}

Assistant:

static FT_Error
  cff_parse_blend( CFF_Parser  parser )
  {
    /* blend operator can only be used in a Private DICT */
    CFF_Private  priv = (CFF_Private)parser->object;
    CFF_SubFont  subFont;
    CFF_Blend    blend;
    FT_UInt      numBlends;
    FT_Error     error;


    if ( !priv || !priv->subfont )
    {
      error = FT_THROW( Invalid_File_Format );
      goto Exit;
    }

    subFont = priv->subfont;
    blend   = &subFont->blend;

    if ( cff_blend_check_vector( blend,
                                 priv->vsindex,
                                 subFont->lenNDV,
                                 subFont->NDV ) )
    {
      error = cff_blend_build_vector( blend,
                                      priv->vsindex,
                                      subFont->lenNDV,
                                      subFont->NDV );
      if ( error )
        goto Exit;
    }

    numBlends = (FT_UInt)cff_parse_num( parser, parser->top - 1 );
    if ( numBlends > parser->stackSize )
    {
      FT_ERROR(( "cff_parse_blend: Invalid number of blends\n" ));
      error = FT_THROW( Invalid_File_Format );
      goto Exit;
    }

    FT_TRACE4(( "   %d value%s blended\n",
                numBlends,
                numBlends == 1 ? "" : "s" ));

    error = cff_blend_doBlend( subFont, parser, numBlends );

    blend->usedBV = TRUE;

  Exit:
    return error;
  }